

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

void DPSprite::NewTick(void)

{
  long lVar1;
  long lVar2;
  int i;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (playeringame[lVar3] == true) {
      lVar1 = (&DAT_00a39370)[lVar3 * 0x54];
      if ((lVar1 != 0) && ((*(byte *)(lVar1 + 0x20) & 0x20) != 0)) {
        (&DAT_00a39370)[lVar3 * 0x54] = 0;
        lVar1 = 0;
      }
      while (lVar2 = lVar1, lVar2 != 0) {
        *(undefined1 *)(lVar2 + 0x84) = 1;
        *(undefined8 *)(lVar2 + 0x38) = *(undefined8 *)(lVar2 + 0x28);
        *(undefined8 *)(lVar2 + 0x40) = *(undefined8 *)(lVar2 + 0x30);
        lVar1 = *(long *)(lVar2 + 0x60);
        if ((lVar1 != 0) && ((*(byte *)(lVar1 + 0x20) & 0x20) != 0)) {
          *(undefined8 *)(lVar2 + 0x60) = 0;
          lVar1 = 0;
        }
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  return;
}

Assistant:

void DPSprite::NewTick()
{
	// This function should be called after the beginning of a tick, before any possible
	// prprite-event, or near the end, after any possible psprite event.
	// Because data is reset for every tick (which it must be) this has no impact on savegames.
	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
		{
			DPSprite *pspr = players[i].psprites;
			while (pspr)
			{
				pspr->processPending = true;
				pspr->oldx = pspr->x;
				pspr->oldy = pspr->y;

				pspr = pspr->Next;
			}
		}
	}
}